

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkCollectHie(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  int iVar1;
  Vec_Ptr_t *vModels;
  void *pvVar2;
  int local_34;
  int i;
  Abc_Ntk_t *pModel;
  Vec_Ptr_t *vResult;
  Vec_Ptr_t *vMods;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                  ,0x1f9,"Vec_Ptr_t *Abc_NtkCollectHie(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                  ,0x1fa,"Vec_Ptr_t *Abc_NtkCollectHie(Abc_Ntk_t *)");
  }
  vModels = Vec_PtrAlloc(1000);
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    Vec_PtrPush(vModels,pNtk);
  }
  else {
    p = pNtk->pDesign->vModules;
    for (local_34 = 0; iVar1 = Vec_PtrSize(p), local_34 < iVar1; local_34 = local_34 + 1) {
      pvVar2 = Vec_PtrEntry(p,local_34);
      *(undefined4 *)((long)pvVar2 + 0xa8) = 0xffffffff;
    }
    Abc_NtkCollectHie_rec(pNtk,vModels);
  }
  return vModels;
}

Assistant:

Vec_Ptr_t * Abc_NtkCollectHie( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods, * vResult;
    Abc_Ntk_t * pModel;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );

    vResult = Vec_PtrAlloc( 1000 );
    if ( pNtk->pDesign == NULL )
    {
        Vec_PtrPush( vResult, pNtk );
        return vResult;
    }

    vMods = pNtk->pDesign->vModules;
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
        pModel->iStep = -1;

    Abc_NtkCollectHie_rec( pNtk, vResult );
    return vResult;    
}